

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O1

void predict_or_learn<true,false>(cs_active *cs_a,single_learner *base,example *ec)

{
  v_array<lq_data> *pvVar1;
  uint64_t *puVar2;
  unsigned_long *puVar3;
  vw *all;
  lq_data *plVar4;
  wclass *pwVar5;
  label_t lVar6;
  single_learner *psVar7;
  bool query_this_label;
  lq_data *lqd_1;
  ostream *poVar8;
  long *plVar9;
  bool *query_needed;
  lq_data *plVar10;
  v_array<lq_data> *__range2;
  ulong uVar11;
  uint uVar12;
  wclass *__begin2;
  label_t lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float score;
  uint32_t prediction;
  example *local_240;
  v_array<unsigned_int> *local_238;
  lq_data *local_230;
  label_t local_228;
  single_learner *local_220;
  label_t local_218;
  v_array<lq_data> *local_210;
  size_t local_208;
  wclass **local_200;
  ulong local_1f8;
  double local_1f0;
  wclass *local_1e8;
  size_t sStack_1e0;
  string local_1d8;
  stringstream filename;
  undefined1 local_1a8 [376];
  
  local_218 = (label_t)(ec->l).cs.costs._begin;
  local_228 = (label_t)(ec->l).cs.costs._end;
  local_1e8 = (ec->l).cs.costs.end_array;
  sStack_1e0 = (ec->l).cs.costs.erase_count;
  local_220 = base;
  if ((ulong)cs_a->num_classes * cs_a->min_labels <= cs_a->all->sd->queries) {
    std::__cxx11::stringstream::stringstream((stringstream *)&filename);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(cs_a->all->final_regressor_name)._M_dataplus._M_p,
                        (cs_a->all->final_regressor_name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    all = cs_a->all;
    std::__cxx11::stringbuf::str();
    VW::save_predictor(all,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"Number of examples with at least one query = ",0x2d);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    cs_a->min_labels = cs_a->min_labels << 1;
    local_240 = ec;
    if ((cs_a->examples_by_queries)._end != (cs_a->examples_by_queries)._begin) {
      uVar11 = 0;
      do {
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
        std::ostream::put('P');
        poVar8 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"examples with ",0xe);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," labels queried = ",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)(cs_a->examples_by_queries)._end -
                                (long)(cs_a->examples_by_queries)._begin >> 3));
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    ec = local_240;
    std::ostream::put('P');
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"labels outside of cost range = ",0x1f);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"average distance to range = ",0x1c);
    std::ostream::_M_insert<double>
              ((double)(cs_a->distance_to_range / (float)cs_a->labels_outside_range));
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"average range = ",0x10);
    std::ostream::_M_insert<double>((double)(cs_a->range / (float)cs_a->labels_outside_range));
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    plVar9 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    std::__cxx11::stringstream::~stringstream((stringstream *)&filename);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  lVar13 = local_228;
  if (cs_a->all->sd->queries < (ulong)cs_a->num_classes * cs_a->max_labels) {
    prediction = 1;
    score = 3.4028235e+38;
    (ec->l).cs.costs._begin = (wclass *)0x0;
    (ec->l).simple.initial = 0.0;
    fVar15 = (float)cs_a->t;
    local_230._0_4_ = (cs_a->cost_max - cs_a->cost_min) * cs_a->c1;
    if (fVar15 < 0.0) {
      local_238 = (v_array<unsigned_int> *)CONCAT44(local_238._4_4_,fVar15 + -1.0);
      fVar14 = sqrtf(fVar15);
      fVar15 = local_238._0_4_;
    }
    else {
      fVar14 = SQRT(fVar15);
      fVar15 = fVar15 + -1.0;
    }
    local_240 = (example *)CONCAT44(local_240._4_4_,fVar14);
    local_200 = &(ec->l).cs.costs.end_array;
    fVar14 = 1.0;
    if (1.0 <= fVar15) {
      fVar14 = fVar15;
    }
    local_238._0_4_ = cs_a->c0;
    fVar15 = logf(fVar14 * (float)cs_a->num_classes);
    psVar7 = local_220;
    lVar6 = local_228;
    if (lVar13 == local_218) {
      if (cs_a->num_classes != 0) {
        uVar12 = 1;
        do {
          puVar2 = &(ec->super_example_predict).ft_offset;
          *puVar2 = *puVar2 + (ulong)(*(int *)(psVar7 + 0xe0) * (uVar12 - 1));
          (**(code **)(psVar7 + 0x30))
                    (*(undefined8 *)(psVar7 + 0x18),*(undefined8 *)(psVar7 + 0x20),ec);
          puVar2 = &(ec->super_example_predict).ft_offset;
          *puVar2 = *puVar2 - (ulong)((uVar12 - 1) * *(int *)(psVar7 + 0xe0));
          fVar15 = ec->partial_prediction;
          if (fVar15 < score) {
LAB_001e6305:
            score = fVar15;
            prediction = uVar12;
          }
          else if (((fVar15 == score) && (!NAN(fVar15) && !NAN(score))) && (uVar12 < prediction))
          goto LAB_001e6305;
          if (ec->passthrough != (features *)0x0) {
            features::push_back(ec->passthrough,fVar15,(ulong)uVar12 ^ 0x398d9fda640553);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 <= cs_a->num_classes);
      }
    }
    else {
      fVar14 = cs_a->cost_max - cs_a->cost_min;
      local_238 = (v_array<unsigned_int> *)
                  CONCAT44(local_238._4_4_,fVar14 * fVar14 * local_238._0_4_ * fVar15);
      local_230 = (lq_data *)CONCAT44(local_230._4_4_,local_230._0_4_ / local_240._0_4_);
      pvVar1 = &cs_a->query_data;
      lVar13 = local_218;
      do {
        _filename = 0;
        local_1a8._0_8_ = lVar13;
        v_array<lq_data>::push_back(pvVar1,(lq_data *)&filename);
        psVar7 = local_220;
        lVar13 = (label_t)((long)lVar13 + 0x10);
      } while (lVar13 != lVar6);
      plVar10 = (cs_a->query_data)._begin;
      plVar4 = (cs_a->query_data)._end;
      if (plVar10 == plVar4) {
        fVar15 = 3.4028235e+38;
      }
      else {
        fVar15 = 3.4028235e+38;
        do {
          local_240 = (example *)CONCAT44(local_240._4_4_,fVar15);
          find_cost_range(cs_a,psVar7,ec,plVar10->cl->class_index,local_238._0_4_,local_230._0_4_,
                          &plVar10->min_pred,&plVar10->max_pred,&plVar10->is_range_large);
          fVar15 = plVar10->max_pred;
          if (local_240._0_4_ <= plVar10->max_pred) {
            fVar15 = local_240._0_4_;
          }
          plVar10 = plVar10 + 1;
        } while (plVar10 != plVar4);
      }
      plVar10 = (cs_a->query_data)._begin;
      plVar4 = (cs_a->query_data)._end;
      if (plVar10 == plVar4) {
        uVar12 = 0;
      }
      else {
        uVar12 = 0;
        do {
          fVar14 = plVar10->min_pred;
          plVar10->is_range_overlapped = fVar15 >= fVar14;
          if (fVar15 < fVar14) {
            uVar11 = 0;
          }
          else {
            uVar11 = (ulong)plVar10->is_range_large ^ 1;
          }
          cs_a->overlapped_and_range_small = cs_a->overlapped_and_range_small + uVar11;
          fVar17 = plVar10->cl->x;
          if ((plVar10->max_pred <= fVar17 && fVar17 != plVar10->max_pred) ||
             (fVar17 < plVar10->min_pred)) {
            cs_a->labels_outside_range = cs_a->labels_outside_range + 1;
            fVar17 = plVar10->cl->x;
            fVar16 = fVar17 - plVar10->max_pred;
            fVar17 = plVar10->min_pred - fVar17;
            if (fVar17 <= fVar16) {
              fVar17 = fVar16;
            }
            cs_a->distance_to_range = fVar17 + cs_a->distance_to_range;
            cs_a->range = (plVar10->max_pred - plVar10->min_pred) + cs_a->range;
          }
          uVar12 = uVar12 + (fVar14 <= fVar15);
          plVar10 = plVar10 + 1;
        } while (plVar10 != plVar4);
      }
      plVar10 = (cs_a->query_data)._begin;
      local_208 = cs_a->all->sd->queries;
      local_230 = (cs_a->query_data)._end;
      local_240 = ec;
      local_210 = pvVar1;
      if (plVar10 != local_230) {
        local_1f0 = (double)local_238._0_4_;
        local_1f8 = (ulong)uVar12;
        query_needed = &plVar10->query_needed;
        local_238 = (v_array<unsigned_int> *)&ec->pred;
        do {
          if ((uVar12 < 2) || (query_this_label = true, cs_a->is_baseline == false)) {
            if (cs_a->use_domination == false) {
              query_this_label = query_needed[-2];
              if ((query_this_label == false) && (1 < uVar12)) goto LAB_001e6487;
            }
            else {
              if (1 < uVar12) {
LAB_001e6487:
                if (query_needed[-1] == true) {
                  query_this_label = query_needed[-2];
                  goto LAB_001e6494;
                }
              }
              query_this_label = false;
            }
          }
LAB_001e6494:
          pwVar5 = *(wclass **)(query_needed + 6);
          inner_loop<true,false>
                    (cs_a,local_220,local_240,pwVar5->class_index,pwVar5->x,&prediction,&score,
                     &pwVar5->partial_prediction,query_this_label,query_needed);
          if (*query_needed == true) {
            v_array<unsigned_int>::push_back
                      (local_238,&(*(wclass **)(query_needed + 6))->class_index);
          }
          if (cs_a->print_debug_stuff == true) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"label=",6);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," x=",3);
            poVar8 = std::ostream::_M_insert<double>((double)(*(wclass **)(query_needed + 6))->x);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," prediction=",0xc);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," score=",7);
            poVar8 = std::ostream::_M_insert<double>((double)score);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," pp=",4);
            poVar8 = std::ostream::_M_insert<double>
                               ((double)(*(wclass **)(query_needed + 6))->partial_prediction);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," ql=",4);
            poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," qn=",4);
            poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," ro=",4);
            poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," rl=",4);
            poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
            poVar8 = std::ostream::_M_insert<double>((double)*(float *)(query_needed + -6));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<double>
                               ((double)((lq_data *)(query_needed + -10))->max_pred);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] vs delta=",0xb);
            poVar8 = std::ostream::_M_insert<double>(local_1f0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," n_overlapped=",0xe);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," is_baseline=",0xd);
            poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          plVar10 = (lq_data *)(query_needed + 0xe);
          query_needed = query_needed + 0x18;
        } while (plVar10 != local_230);
      }
      pvVar1 = local_210;
      if (local_210->_begin != (lq_data *)0x0) {
        free(local_210->_begin);
      }
      pvVar1->_begin = (lq_data *)0x0;
      pvVar1->_end = (lq_data *)0x0;
      pvVar1->end_array = (lq_data *)0x0;
      if (cs_a->all->sd->queries != local_208) {
        cs_a->num_any_queries = cs_a->num_any_queries + 1;
      }
      puVar3 = (cs_a->examples_by_queries)._begin + (cs_a->all->sd->queries - local_208);
      *puVar3 = *puVar3 + 1;
      local_240->partial_prediction = score;
      cs_a->t = cs_a->t + 1;
      ec = local_240;
    }
    (ec->pred).multiclass = prediction;
    (ec->l).multi = local_218;
    (ec->l).cs.costs._end = (wclass *)local_228;
    *local_200 = local_1e8;
    local_200[1] = (wclass *)sStack_1e0;
  }
  return;
}

Assistant:

void predict_or_learn(cs_active& cs_a, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;

  // cerr << "is_learn=" << is_learn << " ld.costs.size()=" << ld.costs.size() << endl;
  if (cs_a.all->sd->queries >= cs_a.min_labels * cs_a.num_classes)
  {
    // save regressor
    stringstream filename;
    filename << cs_a.all->final_regressor_name << "." << ec.example_counter << "." << cs_a.all->sd->queries << "."
             << cs_a.num_any_queries;
    VW::save_predictor(*(cs_a.all), filename.str());
    cerr << endl << "Number of examples with at least one query = " << cs_a.num_any_queries;
    // Double label query budget
    cs_a.min_labels *= 2;
    for (size_t i = 0; i < cs_a.examples_by_queries.size(); i++)
    {
      cerr << endl << "examples with " << i << " labels queried = " << cs_a.examples_by_queries[i];
    }

    cerr << endl << "labels outside of cost range = " << cs_a.labels_outside_range;
    cerr << endl << "average distance to range = " << cs_a.distance_to_range / ((float)cs_a.labels_outside_range);
    cerr << endl << "average range = " << cs_a.range / ((float)cs_a.labels_outside_range);

    /*
    for (size_t i=0; i<cs_a.all->sd->distance_to_range.size(); i++)
    {  cerr << endl << "label " << i << ", average distance to range = " <<
    cs_a.all->sd->distance_to_range[i]/((float)(cs_a.t-1));
    }*/

    cerr << endl << endl;
  }

  if (cs_a.all->sd->queries >= cs_a.max_labels * cs_a.num_classes)
    return;

  uint32_t prediction = 1;
  float score = FLT_MAX;
  ec.l.simple = {0., 0., 0.};

  float min_max_cost = FLT_MAX;
  float t = (float)cs_a.t;  // ec.example_t;  // current round
  float t_prev = t - 1.f;   // ec.weight; // last round

  float eta = cs_a.c1 * (cs_a.cost_max - cs_a.cost_min) / sqrt(t);  // threshold on cost range
  float delta = cs_a.c0 * log((float)(cs_a.num_classes * max(t_prev, 1.f))) *
      pow(cs_a.cost_max - cs_a.cost_min, 2);  // threshold on empirical loss difference

  if (ld.costs.size() > 0)
  {
    // Create metadata structure
    for (COST_SENSITIVE::wclass& cl : ld.costs)
    {
      lq_data f = {0.0, 0.0, 0, 0, 0, cl};
      cs_a.query_data.push_back(f);
    }
    uint32_t n_overlapped = 0;
    for (lq_data& lqd : cs_a.query_data)
    {
      find_cost_range(cs_a, base, ec, lqd.cl.class_index, delta, eta, lqd.min_pred, lqd.max_pred, lqd.is_range_large);
      min_max_cost = min(min_max_cost, lqd.max_pred);
    }
    for (lq_data& lqd : cs_a.query_data)
    {
      lqd.is_range_overlapped = (lqd.min_pred <= min_max_cost);
      n_overlapped += (uint32_t)(lqd.is_range_overlapped);
      // large_range = large_range || (cl.is_range_overlapped && cl.is_range_large);
      // if(cl.is_range_overlapped && is_learn)
      //{ cout << "label " << cl.class_index << ", min_pred = " << cl.min_pred << ", max_pred = " << cl.max_pred << ",
      // is_range_large = " << cl.is_range_large << ", eta = " << eta << ", min_max_cost = " << min_max_cost << endl;
      //}
      cs_a.overlapped_and_range_small += (size_t)(lqd.is_range_overlapped && !lqd.is_range_large);
      if (lqd.cl.x > lqd.max_pred || lqd.cl.x < lqd.min_pred)
      {
        cs_a.labels_outside_range++;
        // cs_a.all->sd->distance_to_range[cl.class_index-1] += max(cl.x - cl.max_pred, cl.min_pred - cl.x);
        cs_a.distance_to_range += max(lqd.cl.x - lqd.max_pred, lqd.min_pred - lqd.cl.x);
        cs_a.range += lqd.max_pred - lqd.min_pred;
      }
    }

    bool query = (n_overlapped > 1);
    size_t queries = cs_a.all->sd->queries;
    // bool any_query = false;
    for (lq_data& lqd : cs_a.query_data)
    {
      bool query_label = ((query && cs_a.is_baseline) || (!cs_a.use_domination && lqd.is_range_large) ||
          (query && lqd.is_range_overlapped && lqd.is_range_large));
      inner_loop<is_learn, is_simulation>(cs_a, base, ec, lqd.cl.class_index, lqd.cl.x, prediction, score,
          lqd.cl.partial_prediction, query_label, lqd.query_needed);
      if (lqd.query_needed)
        ec.pred.multilabels.label_v.push_back(lqd.cl.class_index);
      if (cs_a.print_debug_stuff)
        cerr << "label=" << lqd.cl.class_index << " x=" << lqd.cl.x << " prediction=" << prediction
             << " score=" << score << " pp=" << lqd.cl.partial_prediction << " ql=" << query_label
             << " qn=" << lqd.query_needed << " ro=" << lqd.is_range_overlapped << " rl=" << lqd.is_range_large << " ["
             << lqd.min_pred << ", " << lqd.max_pred << "] vs delta=" << delta << " n_overlapped=" << n_overlapped
             << " is_baseline=" << cs_a.is_baseline << endl;
    }

    // Need to pop metadata
    cs_a.query_data.delete_v();

    if (cs_a.all->sd->queries - queries > 0)
      cs_a.num_any_queries++;

    cs_a.examples_by_queries[cs_a.all->sd->queries - queries] += 1;
    // if(any_query)
    // cs_a.num_any_queries++;

    ec.partial_prediction = score;
    if (is_learn)
    {
      cs_a.t++;
    }
  }
  else
  {
    float temp = 0.f;
    bool temp2 = false, temp3 = false;
    for (uint32_t i = 1; i <= cs_a.num_classes; i++)
    {
      inner_loop<false, is_simulation>(cs_a, base, ec, i, FLT_MAX, prediction, score, temp, temp2, temp3);
    }
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}